

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void renameTableFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  byte *pbVar1;
  long lVar2;
  sqlite3 *db;
  sqlite3_xauth p_Var3;
  FKey *pFVar4;
  TriggerStep *pTVar5;
  int iVar6;
  uchar *zDatabase;
  uchar *zSql;
  uchar *zName;
  uchar *zNew;
  i64 iVar7;
  SrcList *pSVar8;
  uint uVar9;
  char *pcVar10;
  long lVar11;
  TriggerStep **ppTVar12;
  int i;
  long lVar13;
  long in_FS_OFFSET;
  NameContext local_270;
  Walker local_238;
  RenameCtx local_208;
  Parse sParse;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  db = context->pOut->db;
  zDatabase = sqlite3_value_text(*argv);
  zSql = sqlite3_value_text(argv[3]);
  zName = sqlite3_value_text(argv[4]);
  zNew = sqlite3_value_text(argv[5]);
  iVar7 = sqlite3VdbeIntValue(argv[6]);
  if (zNew == (uchar *)0x0 || (zName == (uchar *)0x0 || zSql == (uchar *)0x0)) goto LAB_0019d516;
  memset(&sParse,0xaa,0x1a8);
  p_Var3 = db->xAuth;
  db->xAuth = (sqlite3_xauth)0x0;
  sqlite3BtreeEnterAll(db);
  local_208.pTab = (Table *)0x0;
  local_208.zOld = (char *)0x0;
  local_208.pList = (RenameToken *)0x0;
  local_208.nList = 0;
  local_208.iCol = 0;
  local_208.pTab = sqlite3FindTable(db,(char *)zName,(char *)zDatabase);
  local_238.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_238.walkerDepth = 0;
  local_238.eCode = 0;
  local_238.mWFlags = 0;
  local_238.xExprCallback = renameTableExprCb;
  local_238.xSelectCallback = renameTableSelectCb;
  local_238.pParse = &sParse;
  local_238.u.pNC = (NameContext *)&local_208;
  iVar6 = renameParseSql(&sParse,(char *)zDatabase,db,(char *)zSql,(int)iVar7);
  if (iVar6 == 0) {
    uVar9 = (uint)db->flags;
    if (sParse.pNewTable == (Table *)0x0) {
      if (sParse.pNewIndex == (Index *)0x0) {
        pcVar10 = (sParse.pNewTrigger)->table;
        iVar6 = sqlite3_stricmp(pcVar10,(char *)zName);
        if ((iVar6 == 0) && ((local_208.pTab)->pSchema == (sParse.pNewTrigger)->pTabSchema)) {
          renameTokenFind(&sParse,&local_208,pcVar10);
        }
        if ((uVar9 >> 0x1a & 1) == 0) {
          iVar6 = renameResolveTrigger(&sParse);
          if (iVar6 != 0) goto LAB_0019d480;
          renameWalkTrigger(&local_238,sParse.pNewTrigger);
          ppTVar12 = &(sParse.pNewTrigger)->step_list;
          while (pTVar5 = *ppTVar12, pTVar5 != (TriggerStep *)0x0) {
            pcVar10 = pTVar5->zTarget;
            if ((pcVar10 != (char *)0x0) &&
               (iVar6 = sqlite3StrICmp(pcVar10,(char *)zName), iVar6 == 0)) {
              renameTokenFind(&sParse,&local_208,pcVar10);
            }
            pSVar8 = pTVar5->pFrom;
            if (pSVar8 != (SrcList *)0x0) {
              lVar11 = 8;
              for (lVar13 = 0; lVar13 < pSVar8->nSrc; lVar13 = lVar13 + 1) {
                pcVar10 = *(char **)((long)pSVar8->a + lVar11 + -8);
                iVar6 = sqlite3_stricmp(pcVar10,(char *)zName);
                if (iVar6 == 0) {
                  renameTokenFind(&sParse,&local_208,pcVar10);
                  pSVar8 = pTVar5->pFrom;
                }
                lVar11 = lVar11 + 0x48;
              }
            }
            ppTVar12 = &pTVar5->pNext;
          }
        }
      }
      else {
        renameTokenFind(&sParse,&local_208,(sParse.pNewIndex)->zName);
        if ((uVar9 >> 0x1a & 1) == 0) {
          sqlite3WalkExpr(&local_238,(sParse.pNewIndex)->pPartIdxWhere);
        }
      }
    }
    else if ((sParse.pNewTable)->eTabType == '\x02') {
      if ((uVar9 >> 0x1a & 1) == 0) {
        local_270.ncFlags = 0;
        local_270.nNestedSelect = 0;
        local_270.pWinSelect = (Select *)0x0;
        local_270.pNext = (NameContext *)0x0;
        local_270.nRef = 0;
        local_270.nNcErr = 0;
        local_270.pSrcList = (SrcList *)0x0;
        local_270.uNC.pEList = (ExprList *)0x0;
        pbVar1 = (byte *)((long)&(((sParse.pNewTable)->u).view.pSelect)->selFlags + 2);
        *pbVar1 = *pbVar1 & 0xdf;
        local_270.pParse = &sParse;
        sqlite3SelectPrep(&sParse,((sParse.pNewTable)->u).view.pSelect,&local_270);
        if (sParse.nErr == 0) {
          sqlite3WalkSelect(&local_238,((sParse.pNewTable)->u).view.pSelect);
        }
        else {
          iVar6 = sParse.rc;
          if (sParse.rc != 0) goto LAB_0019d480;
        }
      }
    }
    else {
      if ((((byte)(db->flags >> 0x1a) & 0x3f & (uVar9 >> 0xe & 1) == 0) == 0) &&
         ((sParse.pNewTable)->eTabType != '\x01')) {
        pFVar4 = (FKey *)&(sParse.pNewTable)->u;
        while (pFVar4 = pFVar4->pNextFrom, pFVar4 != (FKey *)0x0) {
          pcVar10 = pFVar4->zTo;
          iVar6 = sqlite3_stricmp(pcVar10,(char *)zName);
          if (iVar6 == 0) {
            renameTokenFind(&sParse,&local_208,pcVar10);
          }
        }
      }
      pcVar10 = (sParse.pNewTable)->zName;
      iVar6 = sqlite3_stricmp((char *)zName,pcVar10);
      if (iVar6 == 0) {
        local_208.pTab = sParse.pNewTable;
        if ((uVar9 >> 0x1a & 1) == 0) {
          sqlite3WalkExprList(&local_238,(sParse.pNewTable)->pCheck);
          pcVar10 = (sParse.pNewTable)->zName;
        }
        renameTokenFind(&sParse,&local_208,pcVar10);
      }
    }
    iVar6 = renameEditSql(context,&local_208,(char *)zSql,(char *)zNew,1);
  }
LAB_0019d480:
  if (iVar6 != 0) {
    if ((iVar6 == 1) && ((db->flags & 0x10000001) == 1)) {
      sqlite3_result_value(context,argv[3]);
    }
    else if (sParse.zErrMsg == (char *)0x0) {
      sqlite3_result_error_code(context,iVar6);
    }
    else {
      renameColumnParseError(context,"",argv[1],argv[2],&sParse);
    }
  }
  renameParseCleanup(&sParse);
  renameTokenFree(db,local_208.pList);
  sqlite3BtreeLeaveAll(db);
  db->xAuth = p_Var3;
LAB_0019d516:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void renameTableFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zDb = (const char*)sqlite3_value_text(argv[0]);
  const char *zInput = (const char*)sqlite3_value_text(argv[3]);
  const char *zOld = (const char*)sqlite3_value_text(argv[4]);
  const char *zNew = (const char*)sqlite3_value_text(argv[5]);
  int bTemp = sqlite3_value_int(argv[6]);
  UNUSED_PARAMETER(NotUsed);

  if( zInput && zOld && zNew ){
    Parse sParse;
    int rc;
    int bQuote = 1;
    RenameCtx sCtx;
    Walker sWalker;

#ifndef SQLITE_OMIT_AUTHORIZATION
    sqlite3_xauth xAuth = db->xAuth;
    db->xAuth = 0;
#endif

    sqlite3BtreeEnterAll(db);

    memset(&sCtx, 0, sizeof(RenameCtx));
    sCtx.pTab = sqlite3FindTable(db, zOld, zDb);
    memset(&sWalker, 0, sizeof(Walker));
    sWalker.pParse = &sParse;
    sWalker.xExprCallback = renameTableExprCb;
    sWalker.xSelectCallback = renameTableSelectCb;
    sWalker.u.pRename = &sCtx;

    rc = renameParseSql(&sParse, zDb, db, zInput, bTemp);

    if( rc==SQLITE_OK ){
      int isLegacy = (db->flags & SQLITE_LegacyAlter);
      if( sParse.pNewTable ){
        Table *pTab = sParse.pNewTable;

        if( IsView(pTab) ){
          if( isLegacy==0 ){
            Select *pSelect = pTab->u.view.pSelect;
            NameContext sNC;
            memset(&sNC, 0, sizeof(sNC));
            sNC.pParse = &sParse;

            assert( pSelect->selFlags & SF_View );
            pSelect->selFlags &= ~SF_View;
            sqlite3SelectPrep(&sParse, pTab->u.view.pSelect, &sNC);
            if( sParse.nErr ){
              rc = sParse.rc;
            }else{
              sqlite3WalkSelect(&sWalker, pTab->u.view.pSelect);
            }
          }
        }else{
          /* Modify any FK definitions to point to the new table. */
#ifndef SQLITE_OMIT_FOREIGN_KEY
          if( (isLegacy==0 || (db->flags & SQLITE_ForeignKeys))
           && !IsVirtual(pTab)
          ){
            FKey *pFKey;
            assert( IsOrdinaryTable(pTab) );
            for(pFKey=pTab->u.tab.pFKey; pFKey; pFKey=pFKey->pNextFrom){
              if( sqlite3_stricmp(pFKey->zTo, zOld)==0 ){
                renameTokenFind(&sParse, &sCtx, (void*)pFKey->zTo);
              }
            }
          }
#endif

          /* If this is the table being altered, fix any table refs in CHECK
          ** expressions. Also update the name that appears right after the
          ** "CREATE [VIRTUAL] TABLE" bit. */
          if( sqlite3_stricmp(zOld, pTab->zName)==0 ){
            sCtx.pTab = pTab;
            if( isLegacy==0 ){
              sqlite3WalkExprList(&sWalker, pTab->pCheck);
            }
            renameTokenFind(&sParse, &sCtx, pTab->zName);
          }
        }
      }

      else if( sParse.pNewIndex ){
        renameTokenFind(&sParse, &sCtx, sParse.pNewIndex->zName);
        if( isLegacy==0 ){
          sqlite3WalkExpr(&sWalker, sParse.pNewIndex->pPartIdxWhere);
        }
      }

#ifndef SQLITE_OMIT_TRIGGER
      else{
        Trigger *pTrigger = sParse.pNewTrigger;
        TriggerStep *pStep;
        if( 0==sqlite3_stricmp(sParse.pNewTrigger->table, zOld)
            && sCtx.pTab->pSchema==pTrigger->pTabSchema
          ){
          renameTokenFind(&sParse, &sCtx, sParse.pNewTrigger->table);
        }

        if( isLegacy==0 ){
          rc = renameResolveTrigger(&sParse);
          if( rc==SQLITE_OK ){
            renameWalkTrigger(&sWalker, pTrigger);
            for(pStep=pTrigger->step_list; pStep; pStep=pStep->pNext){
              if( pStep->zTarget && 0==sqlite3_stricmp(pStep->zTarget, zOld) ){
                renameTokenFind(&sParse, &sCtx, pStep->zTarget);
              }
              if( pStep->pFrom ){
                int i;
                for(i=0; i<pStep->pFrom->nSrc; i++){
                  SrcItem *pItem = &pStep->pFrom->a[i];
                  if( 0==sqlite3_stricmp(pItem->zName, zOld) ){
                    renameTokenFind(&sParse, &sCtx, pItem->zName);
                  }
                }
              }
            }
          }
        }
      }
#endif
    }

    if( rc==SQLITE_OK ){
      rc = renameEditSql(context, &sCtx, zInput, zNew, bQuote);
    }
    if( rc!=SQLITE_OK ){
      if( rc==SQLITE_ERROR && sqlite3WritableSchema(db) ){
        sqlite3_result_value(context, argv[3]);
      }else if( sParse.zErrMsg ){
        renameColumnParseError(context, "", argv[1], argv[2], &sParse);
      }else{
        sqlite3_result_error_code(context, rc);
      }
    }

    renameParseCleanup(&sParse);
    renameTokenFree(db, sCtx.pList);
    sqlite3BtreeLeaveAll(db);
#ifndef SQLITE_OMIT_AUTHORIZATION
    db->xAuth = xAuth;
#endif
  }

  return;
}